

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControlTextArea.cpp
# Opt level: O1

void __thiscall
Rml::ElementFormControlTextArea::OnPropertyChange
          (ElementFormControlTextArea *this,PropertyIdSet *changed_properties)

{
  bool bVar1;
  bool bVar2;
  size_t __i_1;
  PropertyIdSet *pPVar3;
  PropertyIdSet *pPVar4;
  size_t __i;
  long lVar5;
  bitset<128UL> __result;
  _WordT local_38 [4];
  
  Element::OnPropertyChange((Element *)this,changed_properties);
  pPVar3 = StyleSheetSpecification::GetRegisteredInheritedProperties();
  pPVar4 = StyleSheetSpecification::GetRegisteredPropertiesForcingLayout();
  local_38[0] = (pPVar3->defined_ids).super__Base_bitset<2UL>._M_w[0];
  local_38[1] = (pPVar3->defined_ids).super__Base_bitset<2UL>._M_w[1];
  lVar5 = 0;
  do {
    local_38[lVar5] = local_38[lVar5] & (pPVar4->defined_ids).super__Base_bitset<2UL>._M_w[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  local_38[2] = local_38[0];
  local_38[3] = local_38[1];
  local_38[0] = (changed_properties->defined_ids).super__Base_bitset<2UL>._M_w[0];
  local_38[1] = (changed_properties->defined_ids).super__Base_bitset<2UL>._M_w[1];
  lVar5 = 0;
  do {
    local_38[lVar5] = local_38[lVar5] & local_38[lVar5 + 2];
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  if (local_38[0] == 0) {
    bVar2 = true;
    do {
      bVar1 = bVar2;
      if (!bVar1) break;
      bVar2 = false;
    } while (local_38[1] == 0);
    if (!bVar1) goto LAB_002a4648;
  }
  WidgetTextInput::ForceFormattingOnNextLayout
            (&((this->widget)._M_t.
               super___uniq_ptr_impl<Rml::WidgetTextInputMultiLine,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
               ._M_t.
               super__Tuple_impl<0UL,_Rml::WidgetTextInputMultiLine_*,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
               .super__Head_base<0UL,_Rml::WidgetTextInputMultiLine_*,_false>._M_head_impl)->
              super_WidgetTextInput);
LAB_002a4648:
  if (((changed_properties->defined_ids).super__Base_bitset<2UL>._M_w[0] & 0x180000000000) != 0) {
    WidgetTextInput::UpdateSelectionColours
              (&((this->widget)._M_t.
                 super___uniq_ptr_impl<Rml::WidgetTextInputMultiLine,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Rml::WidgetTextInputMultiLine_*,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
                 .super__Head_base<0UL,_Rml::WidgetTextInputMultiLine_*,_false>._M_head_impl)->
                super_WidgetTextInput);
  }
  if (((changed_properties->defined_ids).super__Base_bitset<2UL>._M_w[0] & 0x200000000000) == 0) {
    return;
  }
  WidgetTextInput::GenerateCursor
            (&((this->widget)._M_t.
               super___uniq_ptr_impl<Rml::WidgetTextInputMultiLine,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
               ._M_t.
               super__Tuple_impl<0UL,_Rml::WidgetTextInputMultiLine_*,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
               .super__Head_base<0UL,_Rml::WidgetTextInputMultiLine_*,_false>._M_head_impl)->
              super_WidgetTextInput);
  return;
}

Assistant:

void ElementFormControlTextArea::OnPropertyChange(const PropertyIdSet& changed_properties)
{
	ElementFormControl::OnPropertyChange(changed_properties);

	// Some inherited properties require text formatting update, mainly font and line-height properties.
	const PropertyIdSet changed_inherited_layout_properties = changed_properties &
		(StyleSheetSpecification::GetRegisteredInheritedProperties() & StyleSheetSpecification::GetRegisteredPropertiesForcingLayout());

	if (!changed_inherited_layout_properties.Empty())
		widget->ForceFormattingOnNextLayout();

	if (changed_properties.Contains(PropertyId::Color) || changed_properties.Contains(PropertyId::BackgroundColor))
		widget->UpdateSelectionColours();

	if (changed_properties.Contains(PropertyId::CaretColor))
		widget->GenerateCursor();
}